

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall icu_63::PluralRuleParser::getNextToken(PluralRuleParser *this,UErrorCode *status)

{
  short sVar1;
  ushort uVar2;
  UnicodeString *that;
  uint uVar3;
  tokenType tVar4;
  char16_t *pcVar5;
  uint uVar6;
  char16_t cVar7;
  long lVar8;
  uint srcStart;
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  that = this->ruleSrc;
  srcStart = this->ruleIndex;
  sVar1 = (that->fUnion).fStackFields.fLengthAndFlags;
  uVar3 = (uint)sVar1;
  if (sVar1 < 0) {
    uVar6 = (that->fUnion).fFields.fLength;
  }
  else {
    uVar6 = (int)uVar3 >> 5;
  }
  if ((int)srcStart < (int)uVar6) {
    lVar8 = (long)(int)srcStart;
    do {
      cVar7 = L'\xffff';
      if (srcStart < uVar6) {
        pcVar5 = (char16_t *)((long)&that->fUnion + 2);
        if ((uVar3 & 2) == 0) {
          pcVar5 = (that->fUnion).fFields.fArray;
        }
        cVar7 = pcVar5[lVar8];
      }
      tVar4 = charType(cVar7);
      this->type = tVar4;
      if (tVar4 != tSpace) break;
      srcStart = srcStart + 1;
      this->ruleIndex = srcStart;
      sVar1 = (that->fUnion).fStackFields.fLengthAndFlags;
      uVar3 = (uint)sVar1;
      if (sVar1 < 0) {
        uVar6 = (that->fUnion).fFields.fLength;
      }
      else {
        uVar6 = (int)uVar3 >> 5;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)uVar6);
  }
  uVar2 = (that->fUnion).fStackFields.fLengthAndFlags;
  if ((short)uVar2 < 0) {
    uVar3 = (that->fUnion).fFields.fLength;
  }
  else {
    uVar3 = (int)(short)uVar2 >> 5;
  }
  if ((int)uVar3 <= (int)srcStart) {
    this->type = tEOF;
    return;
  }
  uVar6 = srcStart;
  switch(this->type) {
  case tNumber:
    if (this->type == tNumber) {
      lVar8 = (long)(int)srcStart;
      do {
        lVar8 = lVar8 + 1;
        sVar1 = (that->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar3 = (that->fUnion).fFields.fLength;
        }
        else {
          uVar3 = (int)sVar1 >> 5;
        }
        uVar6 = (uint)lVar8;
        if ((int)uVar3 <= lVar8) break;
        cVar7 = L'\xffff';
        if (uVar6 < uVar3) {
          pcVar5 = (char16_t *)((long)&that->fUnion + 2);
          if (((int)sVar1 & 2U) == 0) {
            pcVar5 = (that->fUnion).fFields.fArray;
          }
          cVar7 = pcVar5[lVar8];
        }
        tVar4 = charType(cVar7);
        this->type = tVar4;
      } while (tVar4 == tNumber);
    }
    this->type = tNumber;
    break;
  default:
    *status = U_FMT_PARSE_ERROR_START;
  case tComma:
  case tSemiColon:
  case tColon:
  case tAt:
  case tEllipsis:
  case tMod:
  case tEqual:
  case tTilde:
    uVar6 = srcStart + 1;
    break;
  case tDot:
    uVar6 = srcStart + 1;
    if (uVar6 < uVar3 && (int)uVar6 < (int)uVar3) {
      if ((uVar2 & 2) == 0) {
        pcVar5 = (that->fUnion).fFields.fArray;
      }
      else {
        pcVar5 = (char16_t *)((long)&that->fUnion + 2);
      }
      if (pcVar5[(int)uVar6] == L'.') {
        uVar6 = srcStart + 2;
        if (uVar6 < uVar3 && (int)uVar6 < (int)uVar3) {
          if ((uVar2 & 2) == 0) {
            pcVar5 = (that->fUnion).fFields.fArray;
          }
          else {
            pcVar5 = (char16_t *)((long)&that->fUnion + 2);
          }
          if (pcVar5[(int)uVar6] == L'.') {
            this->type = tEllipsis;
            uVar6 = srcStart + 3;
            break;
          }
        }
        this->type = tDot2;
      }
    }
    break;
  case tKeyword:
    if (this->type == tKeyword) {
      lVar8 = (long)(int)srcStart;
      do {
        lVar8 = lVar8 + 1;
        sVar1 = (that->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar3 = (that->fUnion).fFields.fLength;
        }
        else {
          uVar3 = (int)sVar1 >> 5;
        }
        uVar6 = (uint)lVar8;
        if ((int)uVar3 <= lVar8) break;
        cVar7 = L'\xffff';
        if (uVar6 < uVar3) {
          pcVar5 = (char16_t *)((long)&that->fUnion + 2);
          if (((int)sVar1 & 2U) == 0) {
            pcVar5 = (that->fUnion).fFields.fArray;
          }
          cVar7 = pcVar5[lVar8];
        }
        tVar4 = charType(cVar7);
        this->type = tVar4;
      } while (tVar4 == tKeyword);
    }
    this->type = tKeyword;
    break;
  case tNotEqual:
    uVar6 = srcStart + 1;
    if (uVar6 < uVar3) {
      if ((uVar2 & 2) == 0) {
        pcVar5 = (that->fUnion).fFields.fArray;
      }
      else {
        pcVar5 = (char16_t *)((long)&that->fUnion + 2);
      }
      if (pcVar5[(int)uVar6] == L'=') {
        uVar6 = srcStart + 2;
        break;
      }
    }
    this->type = none;
  }
  UnicodeString::UnicodeString(&local_70,that,srcStart,uVar6 - srcStart);
  UnicodeString::moveFrom(&this->token,&local_70);
  UnicodeString::~UnicodeString(&local_70);
  this->ruleIndex = uVar6;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }